

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* despot::Tokenize(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *__return_storage_ptr__,string *str,string *delimiters)

{
  value_type local_58;
  long local_38;
  size_type pos;
  size_type last_pos;
  string *local_20;
  string *delimiters_local;
  string *str_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokens;
  
  last_pos._7_1_ = 0;
  local_20 = delimiters;
  delimiters_local = str;
  str_local = (string *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  pos = std::__cxx11::string::find_first_not_of((string *)delimiters_local,(ulong)local_20);
  local_38 = std::__cxx11::string::find_first_of((string *)delimiters_local,(ulong)local_20);
  while (local_38 != -1 || pos != 0xffffffffffffffff) {
    std::__cxx11::string::substr((ulong)&local_58,(ulong)delimiters_local);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    pos = std::__cxx11::string::find_first_not_of((string *)delimiters_local,(ulong)local_20);
    local_38 = std::__cxx11::string::find_first_of((string *)delimiters_local,(ulong)local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string> Tokenize(const string& str, const string& delimiters) {
	vector<string> tokens;
	string::size_type last_pos = str.find_first_not_of(delimiters, 0);
	string::size_type pos = str.find_first_of(delimiters, last_pos);

	while (string::npos != pos || string::npos != last_pos) {
		tokens.push_back(str.substr(last_pos, pos - last_pos));

		last_pos = str.find_first_not_of(delimiters, pos);
		pos = str.find_first_of(delimiters, last_pos);
	}
	return tokens;
}